

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceManager.cpp
# Opt level: O1

uint64_t __thiscall slang::SourceManager::getSortKey(SourceManager *this,BufferID buffer)

{
  pointer pvVar1;
  ulong uVar2;
  pointer pvVar3;
  uint64_t uVar4;
  
  uVar2 = (ulong)buffer.id;
  std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)this);
  if ((buffer.id == 0) ||
     (pvVar1 = (this->bufferEntries).
               super__Vector_base<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>,_std::allocator<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
     (ulong)((long)(this->bufferEntries).
                   super__Vector_base<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>,_std::allocator<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1 >> 6) <= uVar2)) {
    pvVar3 = (pointer)0x0;
  }
  else {
    pvVar3 = (pointer)0x0;
    if (*(__index_type *)
         ((long)&pvVar1[uVar2].
                 super__Variant_base<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
                 .
                 super__Move_assign_alias<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
                 .
                 super__Copy_assign_alias<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
         + 0x38) == '\0') {
      pvVar3 = pvVar1 + uVar2;
    }
  }
  if (pvVar3 == (pointer)0x0) {
    uVar4 = uVar2 << 0x20;
  }
  else {
    uVar4 = *(uint64_t *)
             ((long)&(pvVar3->
                     super__Variant_base<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
                     ).
                     super__Move_assign_alias<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
                     .
                     super__Copy_assign_alias<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
             + 0x18);
  }
  pthread_rwlock_unlock((pthread_rwlock_t *)this);
  return uVar4;
}

Assistant:

uint64_t SourceManager::getSortKey(BufferID buffer) const {
    std::shared_lock<std::shared_mutex> lock(mutex);
    auto info = getFileInfo(buffer, lock);
    if (!info)
        return uint64_t(buffer.getId()) << 32;

    return info->sortKey;
}